

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O1

cmCTestGenericHandler * __thiscall
cmCTestUploadCommand::InitializeHandler(cmCTestUploadCommand *this)

{
  cmCTestUploadHandler *this_00;
  string local_38;
  
  this_00 = (cmCTestUploadHandler *)
            cmCTest::GetInitializedHandler
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"upload");
  if (this_00 == (cmCTestUploadHandler *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"internal CTest error. Cannot instantiate upload handler","");
    cmCommand::SetError((cmCommand *)this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    this_00 = (cmCTestUploadHandler *)0x0;
  }
  else {
    cmCTestUploadHandler::SetFiles(this_00,&this->Files);
    (this_00->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  }
  return &this_00->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestUploadCommand::InitializeHandler()
{
  cmCTestGenericHandler* handler =
    this->CTest->GetInitializedHandler("upload");
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate upload handler");
    return CM_NULLPTR;
  }
  static_cast<cmCTestUploadHandler*>(handler)->SetFiles(this->Files);

  handler->SetQuiet(this->Quiet);
  return handler;
}